

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O2

void __thiscall
testing::Action<pstore::serialize::archive::void_type_(const_int_&)>::Action
          (Action<pstore::serialize::archive::void_type_(const_int_&)> *this,
          ActionInterface<pstore::serialize::archive::void_type_(const_int_&)> *impl)

{
  __shared_ptr<testing::ActionInterface<pstore::serialize::archive::void_type(int_const&)>,(__gnu_cxx::_Lock_policy)2>
  local_20 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  std::
  __shared_ptr<testing::ActionInterface<pstore::serialize::archive::void_type(int_const&)>,(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr<testing::ActionInterface<pstore::serialize::archive::void_type(int_const&)>,void>
            (local_20,impl);
  std::function<pstore::serialize::archive::void_type(int_const&)>::
  function<testing::Action<pstore::serialize::archive::void_type(int_const&)>::ActionAdapter,void>
            ((function<pstore::serialize::archive::void_type(int_const&)> *)this,
             (ActionAdapter *)local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18);
  return;
}

Assistant:

explicit Action(ActionInterface<F>* impl)
      : fun_(ActionAdapter{::std::shared_ptr<ActionInterface<F>>(impl)}) {}